

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  bool bVar1;
  byte bVar2;
  OfType OVar3;
  string *name;
  size_t sVar4;
  reference pMVar5;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  MessageInfo *msg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *__range2;
  ReusableStringStream rss;
  ScopedElement e;
  AssertionResult *result;
  string elementName;
  AssertionResult *in_stack_fffffffffffffd68;
  AssertionResult *in_stack_fffffffffffffd70;
  string *in_stack_fffffffffffffd78;
  Column *in_stack_fffffffffffffd80;
  ReusableStringStream *in_stack_fffffffffffffd88;
  AssertionResult *in_stack_fffffffffffffd90;
  XmlFormatting fmt;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9f;
  AssertionResult *in_stack_fffffffffffffda0;
  string *in_stack_fffffffffffffda8;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  StringRef *in_stack_fffffffffffffdb8;
  XmlWriter *this_00;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  local_1e0;
  long local_1d8;
  undefined1 local_1cb;
  undefined1 local_1ca;
  undefined1 local_1c9;
  Column local_1c8;
  undefined1 local_191;
  StringRef local_178;
  undefined1 local_162 [42];
  long local_138;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_162._34_8_ = in_RSI + 8;
  local_138 = in_RSI;
  bVar1 = AssertionResult::isOk(in_stack_fffffffffffffd70);
  if (bVar1) goto LAB_00253e8c;
  std::__cxx11::string::string(local_28);
  OVar3 = AssertionResult::getResultType((AssertionResult *)local_162._34_8_);
  if (((uint)(OVar3 + Info) < 4) || (OVar3 == FailureBit)) {
LAB_0025372f:
    std::__cxx11::string::operator=(local_28,"internalError");
  }
  else if ((uint)(OVar3 + ~FailureBit) < 2) {
LAB_00253717:
    std::__cxx11::string::operator=(local_28,"failure");
  }
  else {
    if (OVar3 == Exception) goto LAB_0025372f;
    if (OVar3 != ThrewException) {
      if (OVar3 == DidntThrowException) goto LAB_00253717;
      if (OVar3 != FatalErrorCondition) goto LAB_00253747;
    }
    std::__cxx11::string::operator=(local_28,"error");
  }
LAB_00253747:
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            ((XmlWriter *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
             (string *)in_stack_fffffffffffffd90,
             (XmlFormatting)((ulong)in_stack_fffffffffffffd88 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"message",(allocator *)(local_162 + 1));
  AssertionResult::getExpression_abi_cxx11_
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98));
  XmlWriter::writeAttribute
            ((XmlWriter *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
             in_stack_fffffffffffffda8,(string *)in_stack_fffffffffffffda0);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)(local_162 + 1));
  name = (string *)(in_RDI + 0xd8);
  this_00 = (XmlWriter *)local_162;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"type",(allocator *)this_00);
  local_178 = AssertionResult::getTestMacroName((AssertionResult *)local_162._34_8_);
  XmlWriter::writeAttribute<Catch::StringRef>(this_00,name,in_stack_fffffffffffffdb8);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)local_162);
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)in_stack_fffffffffffffda0);
  sVar4 = Counts::total((Counts *)(local_138 + 0xb8));
  if (sVar4 == 0) {
    local_1ca = 10;
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
  }
  else {
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffd70,
               (char (*) [7])in_stack_fffffffffffffd68);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffd70,
               (char (*) [3])in_stack_fffffffffffffd68);
    bVar1 = AssertionResult::hasExpression((AssertionResult *)0x253920);
    if (bVar1) {
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffd70,
                 (char (*) [3])in_stack_fffffffffffffd68);
      AssertionResult::getExpressionInMacro_abi_cxx11_(in_stack_fffffffffffffda0);
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffd70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd68);
      std::__cxx11::string::~string(local_a8);
      local_191 = 10;
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68
                );
    }
    bVar1 = AssertionResult::hasExpandedExpression(in_stack_fffffffffffffd90);
    if (bVar1) {
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffd70,
                 (char (*) [17])in_stack_fffffffffffffd68);
      AssertionResult::getExpandedExpression_abi_cxx11_(in_stack_fffffffffffffd90);
      clara::TextFlow::Column::Column(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      clara::TextFlow::Column::indent(&local_1c8,2);
      in_stack_fffffffffffffda0 =
           (AssertionResult *)
           ReusableStringStream::operator<<
                     ((ReusableStringStream *)in_stack_fffffffffffffd70,
                      (Column *)in_stack_fffffffffffffd68);
      local_1c9 = 10;
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68
                );
      clara::TextFlow::Column::~Column((Column *)0x253b6a);
      std::__cxx11::string::~string(local_c8);
    }
  }
  AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffd68);
  bVar2 = std::__cxx11::string::empty();
  bVar2 = bVar2 ^ 0xff;
  std::__cxx11::string::~string(local_e8);
  if ((bVar2 & 1) != 0) {
    AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffd68);
    in_stack_fffffffffffffd90 =
         (AssertionResult *)
         ReusableStringStream::operator<<
                   ((ReusableStringStream *)in_stack_fffffffffffffd70,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffffd68);
    local_1cb = 10;
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
    std::__cxx11::string::~string(local_108);
  }
  local_1d8 = local_138 + 0x98;
  local_1e0._M_current =
       (MessageInfo *)
       clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                 ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                  in_stack_fffffffffffffd68);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
             in_stack_fffffffffffffd68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                        *)in_stack_fffffffffffffd70,
                       (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                        *)in_stack_fffffffffffffd68);
    fmt = (XmlFormatting)((ulong)in_stack_fffffffffffffd90 >> 0x20);
    if (!bVar1) break;
    pMVar5 = __gnu_cxx::
             __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
             ::operator*(&local_1e0);
    if (pMVar5->type == Info) {
      in_stack_fffffffffffffd88 =
           ReusableStringStream::operator<<
                     ((ReusableStringStream *)in_stack_fffffffffffffd70,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffd68);
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68
                );
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
    ::operator++(&local_1e0);
  }
  ReusableStringStream::operator<<
            ((ReusableStringStream *)in_stack_fffffffffffffd70,
             (char (*) [4])in_stack_fffffffffffffd68);
  AssertionResult::getSourceInfo((AssertionResult *)local_162._34_8_);
  ReusableStringStream::operator<<
            ((ReusableStringStream *)in_stack_fffffffffffffd70,
             (SourceLineInfo *)in_stack_fffffffffffffd68);
  ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffd68);
  XmlWriter::writeText
            ((XmlWriter *)in_stack_fffffffffffffda0,
             (string *)CONCAT17(bVar2,in_stack_fffffffffffffd98),fmt);
  std::__cxx11::string::~string(local_128);
  ReusableStringStream::~ReusableStringStream(in_stack_fffffffffffffd88);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffd70);
  std::__cxx11::string::~string(local_28);
LAB_00253e8c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void JunitReporter::writeAssertion( AssertionStats const& stats ) {
        AssertionResult const& result = stats.assertionResult;
        if( !result.isOk() ) {
            std::string elementName;
            switch( result.getResultType() ) {
                case ResultWas::ThrewException:
                case ResultWas::FatalErrorCondition:
                    elementName = "error";
                    break;
                case ResultWas::ExplicitFailure:
                case ResultWas::ExpressionFailed:
                case ResultWas::DidntThrowException:
                    elementName = "failure";
                    break;

                // We should never see these here:
                case ResultWas::Info:
                case ResultWas::Warning:
                case ResultWas::Ok:
                case ResultWas::Unknown:
                case ResultWas::FailureBit:
                case ResultWas::Exception:
                    elementName = "internalError";
                    break;
            }

            XmlWriter::ScopedElement e = xml.scopedElement( elementName );

            xml.writeAttribute( "message", result.getExpression() );
            xml.writeAttribute( "type", result.getTestMacroName() );

            ReusableStringStream rss;
            if (stats.totals.assertions.total() > 0) {
                rss << "FAILED" << ":\n";
                if (result.hasExpression()) {
                    rss << "  ";
                    rss << result.getExpressionInMacro();
                    rss << '\n';
                }
                if (result.hasExpandedExpression()) {
                    rss << "with expansion:\n";
                    rss << Column(result.getExpandedExpression()).indent(2) << '\n';
                }
            } else {
                rss << '\n';
            }

            if( !result.getMessage().empty() )
                rss << result.getMessage() << '\n';
            for( auto const& msg : stats.infoMessages )
                if( msg.type == ResultWas::Info )
                    rss << msg.message << '\n';

            rss << "at " << result.getSourceInfo();
            xml.writeText( rss.str(), XmlFormatting::Newline );
        }
    }